

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int rewrite_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,MIR_reg_t base_reg,rewrite_data *data)

{
  undefined1 auVar1 [32];
  MIR_context_t pMVar2;
  void *pvVar3;
  const_bitmap_t bm;
  FILE *__stream;
  undefined8 *puVar4;
  undefined8 uVar5;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar6 [32];
  anon_union_32_12_57d33f68_for_u aVar7;
  undefined1 auVar8 [32];
  anon_union_32_12_57d33f68_for_u aVar9;
  undefined1 auVar10 [32];
  anon_union_32_12_57d33f68_for_u aVar11;
  undefined1 auVar12 [32];
  uint uVar13;
  MIR_op_mode_t MVar14;
  MIR_reg_t MVar15;
  int iVar16;
  MIR_type_t MVar17;
  ra_ctx *prVar18;
  int64_t iVar19;
  MIR_insn_t_conflict pMVar20;
  MIR_disp_t MVar21;
  MIR_insn_t_conflict insn_00;
  bb_t_conflict pbVar22;
  MIR_op_t *pMVar23;
  ushort uVar24;
  ulong uVar25;
  anon_union_32_12_57d33f68_for_u *paVar26;
  uint uVar27;
  MIR_op_t *pMVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  MIR_op_t *pMVar32;
  MIR_reg_t *pMVar33;
  size_t sVar34;
  MIR_context_t pMVar35;
  int out_p;
  uint local_1f0;
  uint local_1ec;
  undefined8 local_1e8;
  MIR_op_t *local_1e0;
  MIR_insn_t local_1d8;
  anon_union_32_12_57d33f68_for_u *local_1d0;
  MIR_context_t local_1c8;
  size_t local_1c0;
  bitmap_iterator_t bi;
  anon_union_32_12_57d33f68_for_u aStack_1a8;
  MIR_op_t mem_op;
  size_t nel;
  undefined8 uStack_150;
  anon_union_32_12_57d33f68_for_u aStack_148;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_op_t out_op;
  MIR_op_t in_op;
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  
  pMVar2 = gen_ctx->ctx;
  MIR_new_int_op(pMVar2,0);
  MIR_new_int_op(pMVar2,0);
  local_1c8 = pMVar2;
  local_1c0 = MIR_insn_nops(pMVar2,insn);
  pMVar28 = insn->ops;
  local_1d0 = (anon_union_32_12_57d33f68_for_u *)&insn->ops[0].u.mem.index;
  local_1f0 = 0xffffffff;
  local_1e8 = (MIR_context_t)((ulong)local_1e8._4_4_ << 0x20);
  local_1ec = local_1f0;
  local_1e0 = pMVar28;
  local_1d8 = insn;
  for (iVar31 = 0; iVar31 != 2; iVar31 = iVar31 + 1) {
    paVar26 = local_1d0;
    for (sVar34 = 0; pMVar28 = local_1e0, local_1c0 != sVar34; sVar34 = sVar34 + 1) {
      MVar14 = MIR_insn_op_mode(local_1c8,insn,sVar34,&out_p);
      if (iVar31 == 0) {
        if ((out_p != 0) && ((char)*(uint *)((long)paVar26 + -0x1c) != '\v')) goto LAB_001432d2;
      }
      else {
        if (iVar31 == 1 && out_p != 0) {
          uVar24 = (ushort)(byte)*(uint *)((long)paVar26 + -0x1c);
          if ((byte)*(uint *)((long)paVar26 + -0x1c) != 0xb) goto LAB_00143564;
        }
        else {
LAB_001432d2:
          uVar24 = (ushort)*(uint *)((long)paVar26 + -0x1c);
        }
        if ((char)uVar24 == '\v') {
          if ((ulong)*(MIR_reg_t *)((long)paVar26 + -4) < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)*(MIR_reg_t *)((long)paVar26 + -4))
            ;
          }
          if ((ulong)paVar26->reg < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)paVar26->reg);
          }
          uVar30 = *(MIR_reg_t *)((long)paVar26 + -4);
          if (((((ulong)uVar30 != 0xffffffff) && (0x21 < uVar30)) &&
              (paVar26->reg - 0x22 < 0xffffffdd)) &&
             ((MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)uVar30),
              0x21 < MVar15 &&
              (MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)paVar26->reg),
              0x21 < MVar15)))) {
            if (out_p == 0) {
              uVar27 = (uint)sVar34;
              uVar13 = local_1ec;
              uVar30 = local_1ec;
              if (-1 < (int)local_1f0) {
                __assert_fail("in_mem_op_num < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1f5f,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            else {
              uVar27 = local_1f0;
              uVar13 = (uint)sVar34;
              uVar30 = local_1f0;
              if (-1 < (int)local_1ec) {
                __assert_fail("out_mem_op_num < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1f5b,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            local_1ec = uVar13;
            local_1f0 = uVar27;
            if ((((int)uVar30 < 0) ||
                (*(MIR_reg_t *)((long)paVar26 + -4) != local_1e0[uVar30].u.mem.base)) ||
               (paVar26->reg != local_1e0[uVar30].u.mem.index)) {
              local_1e8 = (MIR_context_t)CONCAT44(local_1e8._4_4_,(MIR_reg_t)local_1e8 + 2);
            }
          }
          if (data != (rewrite_data *)0x0) {
            if ((ulong)*(MIR_reg_t *)((long)paVar26 + -4) != 0xffffffff) {
              bitmap_set_bit_p(data->live,(ulong)*(MIR_reg_t *)((long)paVar26 + -4));
              if ((0x21 < (ulong)*(MIR_reg_t *)((long)paVar26 + -4)) &&
                 (iVar16 = bitmap_clear_bit_p(data->regs_to_save,
                                              (ulong)*(MIR_reg_t *)((long)paVar26 + -4)),
                 iVar16 != 0)) {
                spill_restore_reg(gen_ctx,*(MIR_reg_t *)((long)paVar26 + -4),base_reg,insn,1,0);
              }
            }
            if ((ulong)paVar26->reg != 0xffffffff) {
              bitmap_set_bit_p(data->live,(ulong)paVar26->reg);
              if ((0x21 < (ulong)paVar26->reg) &&
                 (iVar16 = bitmap_clear_bit_p(data->regs_to_save,(ulong)paVar26->reg), iVar16 != 0))
              {
                uVar30 = paVar26->reg;
LAB_0014354b:
                spill_restore_reg(gen_ctx,uVar30,base_reg,insn,1,0);
              }
            }
          }
        }
        else if ((uVar24 & 0xff) == 2) {
          uVar25 = (ulong)*(uint *)((long)paVar26 + -0x14);
          if (uVar25 < 0x22) {
            bitmap_set_bit_p(gen_ctx->func_used_hard_regs,uVar25);
            if (data != (rewrite_data *)0x0) {
              update_live(*(MIR_reg_t *)((long)paVar26 + -0x14),out_p,data->live);
            }
          }
          else {
            if (out_p == 0) {
              MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,uVar25);
              local_1e8 = (MIR_context_t)
                          CONCAT44(local_1e8._4_4_,
                                   (MIR_reg_t)local_1e8 +
                                   (MVar14 - MIR_OP_REF < 0xfffffffd && 0x21 < MVar15));
            }
            if (data != (rewrite_data *)0x0) {
              update_live(*(MIR_reg_t *)((long)paVar26 + -0x14),out_p,data->live);
              iVar16 = bitmap_clear_bit_p(data->regs_to_save,(ulong)*(uint *)((long)paVar26 + -0x14)
                                         );
              if (iVar16 != 0) {
                uVar30 = *(uint *)((long)paVar26 + -0x14);
                goto LAB_0014354b;
              }
            }
          }
        }
      }
LAB_00143564:
      paVar26 = (anon_union_32_12_57d33f68_for_u *)((long)paVar26 + 0x30);
    }
    if (data != (rewrite_data *)0x0 && iVar31 == 0) {
      target_get_early_clobbered_hard_regs(insn,(MIR_reg_t *)&mem_op,&early_clobbered_hard_reg2);
      if ((ulong)(uint)mem_op.data != 0xffffffff) {
        bitmap_clear_bit_p(data->live,(ulong)(uint)mem_op.data);
      }
      if ((ulong)early_clobbered_hard_reg2 != 0xffffffff) {
        bitmap_clear_bit_p(data->live,(ulong)early_clobbered_hard_reg2);
      }
      if (0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) {
        bi.bitmap = gen_ctx->call_used_hard_regs[0x12];
        pvVar3 = insn->data;
        bi.nbit = 0;
        while (iVar16 = bitmap_iterator_next(&bi,&nel), iVar16 != 0) {
          bitmap_clear_bit_p(data->live,(ulong)(uint)nel);
        }
        bi.bitmap = *(bitmap_t *)((long)pvVar3 + 0x48);
        bi.nbit = 0;
        while (iVar16 = bitmap_iterator_next(&bi,&nel), iVar16 != 0) {
          bitmap_set_bit_p(data->live,(ulong)(uint)nel);
        }
        bi.bitmap = data->live;
        bi.nbit = 0;
LAB_00143688:
        iVar16 = bitmap_iterator_next(&bi,&nel);
        uVar30 = (uint)nel;
        pMVar28 = local_1e0;
        insn = local_1d8;
        if (iVar16 != 0) {
          if (0x21 < CONCAT44(nel._4_4_,(uint)nel)) {
            uVar25 = (ulong)(uint)nel;
            iVar16 = bitmap_bit_p(data->bb->gen,uVar25);
            if ((iVar16 == 0) &&
               (MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,uVar25), MVar15 < 0x22)) {
              MIR_reg_type(gen_ctx->ctx,uVar30 - 0x21,(gen_ctx->curr_func_item->u).func);
              bm = gen_ctx->call_used_hard_regs[0x12];
              lVar29 = 0;
              do {
                if (lVar29 == 1) goto LAB_00143688;
                iVar16 = bitmap_bit_p(bm,(ulong)(MVar15 + (int)lVar29));
                lVar29 = lVar29 + 1;
              } while (iVar16 == 0);
              iVar16 = bitmap_set_bit_p(data->regs_to_save,uVar25);
              if (iVar16 != 0) {
                spill_restore_reg(gen_ctx,uVar30,base_reg,local_1d8,1,1);
              }
            }
          }
          goto LAB_00143688;
        }
      }
    }
  }
  prVar18 = gen_ctx->ra_ctx;
  prVar18->in_reloads_num = 0;
  prVar18->out_reloads_num = 0;
  if (2 < (int)(MIR_reg_t)local_1e8) {
    if ((int)(local_1f0 & local_1ec) < 0) {
      __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    pMVar2 = gen_ctx->ctx;
    pMVar35 = (MIR_context_t)(ulong)local_1f0;
    pMVar33 = (MIR_reg_t *)(ulong)local_1ec;
    uVar30 = local_1f0;
    if (-1 < (int)local_1ec) {
      uVar30 = local_1ec;
    }
    local_1e8 = (MIR_context_t)(ulong)local_1e0[(int)uVar30].u.mem.base;
    uVar27 = local_1e0[(int)uVar30].u.mem.index;
    if (-1 < (int)(local_1f0 | local_1ec)) {
      pMVar28 = local_1e0 + (long)pMVar35;
      uVar5 = *(undefined8 *)((long)&pMVar28->u + 8);
      op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar28->field_0x8 >> 0x20);
      op1.data = pMVar28->data;
      op1._8_4_ = *(undefined4 *)&pMVar28->field_0x8;
      op1.u.i = (pMVar28->u).i;
      op1.u.mem.nonalias = (int)uVar5;
      op1.u.mem.nloc = (int)((ulong)uVar5 >> 0x20);
      op1.u._16_8_ = *(undefined8 *)((long)&local_1e0[(long)pMVar35].u + 0x10);
      op1.u.mem.disp = local_1e0[(long)pMVar35].u.mem.disp;
      op2.u._16_8_ = *(undefined8 *)((long)&local_1e0[(long)pMVar33].u + 0x10);
      op2._0_32_ = *(undefined1 (*) [32])(local_1e0 + (long)pMVar33);
      op2.u.mem.disp = local_1e0[(long)pMVar33].u.mem.disp;
      iVar31 = MIR_op_eq_p(pMVar2,op1,op2);
      if (iVar31 == 0) {
        __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
      }
      prVar18 = gen_ctx->ra_ctx;
    }
    pMVar28 = local_1e0;
    sVar34 = (size_t)local_1e8;
    local_1e8 = pMVar35;
    local_1d0 = (anon_union_32_12_57d33f68_for_u *)pMVar33;
    MVar15 = VARR_MIR_reg_tget(prVar18->reg_renumber,sVar34);
    insn = local_1d8;
    add_ld_st(gen_ctx,(MIR_op_t *)&bi,MVar15,base_reg,MIR_OP_INT,10,0,10,local_1d8,0);
    MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)uVar27);
    add_ld_st(gen_ctx,(MIR_op_t *)&bi,MVar15,base_reg,MIR_OP_INT,0xb,0,0xb,insn,0);
    _MIR_new_var_op(pMVar2,10);
    _MIR_new_var_op(pMVar2,0xb);
    uVar25 = (ulong)pMVar28[(int)uVar30].u.mem.scale;
    if (uVar25 != 1) {
      iVar19 = gen_int_log2(uVar25);
      MIR_new_int_op(pMVar2,iVar19);
      pMVar20 = MIR_new_insn(pMVar2,MIR_LSH);
      gen_add_insn_before(gen_ctx,insn,pMVar20);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
        MIR_output_insn(pMVar2,gen_ctx->debug_file,pMVar20,(gen_ctx->curr_func_item->u).func,1);
      }
    }
    pMVar20 = MIR_new_insn(pMVar2,MIR_ADD);
    gen_add_insn_before(gen_ctx,insn,pMVar20);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,pMVar20,(gen_ctx->curr_func_item->u).func,1);
    }
    pMVar28 = local_1e0;
    if (-1 < (int)local_1ec) {
      *(undefined8 *)((long)&local_1e0[(long)local_1d0].u + 0x10) = 0xffffffff0000000a;
    }
    if (-1 < (int)local_1f0) {
      *(undefined8 *)((long)&local_1e0[(long)local_1e8].u + 0x10) = 0xffffffff0000000a;
    }
    get_reload_hreg(gen_ctx,0xffffffff,6,0);
  }
  iVar31 = *(int *)&insn->field_0x18;
  if (0xfffffffb < iVar31 - 0x22U) {
    if (*(char *)&insn[1].insn_link.prev != '\x02') {
      __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    uVar30 = *(uint *)&insn[1].insn_link.next;
    if (0xffffffdc < uVar30 - 0x22) {
      __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    pMVar2 = gen_ctx->ctx;
    MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)uVar30);
    MVar17 = MIR_reg_type(pMVar2,uVar30 - 0x21,(gen_ctx->curr_func_item->u).func);
    if (MVar15 < 0x22) {
      __assert_fail("loc > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
    }
    MVar21 = target_get_stack_slot_offset(gen_ctx,MVar17,MVar15 - 0x22);
    MVar15 = get_reload_hreg(gen_ctx,0xffffffff,6,0);
    _MIR_new_var_op(pMVar2,MVar15);
    iVar19 = _MIR_addr_offset(pMVar2,*(MIR_insn_code_t *)&insn->field_0x18);
    MIR_new_int_op(pMVar2,MVar21 + iVar19);
    pMVar20 = MIR_new_insn(pMVar2,MIR_MOV);
    _MIR_new_var_op(pMVar2,MVar15);
    local_1e8 = (MIR_context_t)CONCAT44(local_1e8._4_4_,MVar15);
    _MIR_new_var_op(pMVar2,MVar15);
    _MIR_new_var_op(pMVar2,base_reg);
    insn_00 = MIR_new_insn(pMVar2,MIR_ADD);
    __stream = (FILE *)gen_ctx->debug_file;
    if ((__stream != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pbVar22 = get_insn_bb(gen_ctx,insn);
      fprintf(__stream,"    Adding before insn (in BB %lu) ",pbVar22->index);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
      fwrite(":\n      ",8,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,pMVar20,(gen_ctx->curr_func_item->u).func,1);
      fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,insn_00,(gen_ctx->curr_func_item->u).func,1);
    }
    gen_add_insn_before(gen_ctx,insn,pMVar20);
    gen_add_insn_before(gen_ctx,insn,insn_00);
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("Changing ",9,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
    }
    *(undefined4 *)&insn->field_0x18 = 0;
    _MIR_new_var_op(pMVar2,(MIR_reg_t)local_1e8);
    auVar1._16_16_ = auStack_88;
    auVar1._0_16_ = local_98;
    auVar12._16_16_ = auStack_78;
    auVar12._0_16_ = auStack_88;
    *(undefined1 (*) [32])&insn[1].insn_link.next = auVar12;
    insn[1].data = (void *)local_98._0_8_;
    insn[1].insn_link.prev = (MIR_insn_t)SUB168(auVar1._8_16_,0);
    insn[1].insn_link.next = (MIR_insn_t)SUB168(auVar1._8_16_,8);
    *(long *)&insn[1].field_0x18 = auStack_88._8_8_;
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite(" to ",4,1,(FILE *)gen_ctx->debug_file);
      MIR_output_insn(pMVar2,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
    }
    iVar31 = *(int *)&insn->field_0x18;
    pMVar28 = local_1e0;
  }
  local_1d0 = &insn->ops[0].u;
  sVar34 = 0;
  do {
    if (sVar34 == local_1c0) {
      iVar31 = 0;
      if (((*(uint *)&insn->field_0x18 & 0xfffffffc) == 0) &&
         (uVar5 = *(undefined8 *)((long)&pMVar28->u + 8),
         op1_00._12_4_ = (int)((ulong)*(undefined8 *)&pMVar28->field_0x8 >> 0x20),
         op1_00.data = pMVar28->data, op1_00._8_4_ = *(undefined4 *)&pMVar28->field_0x8,
         op1_00.u.i = (pMVar28->u).i, op1_00.u.mem.nonalias = (int)uVar5,
         op1_00.u.mem.nloc = (int)((ulong)uVar5 >> 0x20),
         op1_00.u._16_8_ = *(undefined8 *)((long)&pMVar28->u + 0x10),
         op1_00.u.mem.disp = (pMVar28->u).mem.disp,
         iVar16 = MIR_op_eq_p(local_1c8,op1_00,*(MIR_op_t *)(insn + 1)), iVar16 != 0)) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("Deleting noop move ",0x13,1,(FILE *)gen_ctx->debug_file);
          pMVar2 = local_1c8;
          MIR_output_insn(local_1c8,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
          fwrite(" which was ",0xb,1,(FILE *)gen_ctx->debug_file);
          (pMVar28->u).i = out_op.u.i;
          (pMVar28->u).str.s = out_op.u.str.s;
          *(undefined8 *)((long)&pMVar28->u + 0x10) = out_op.u._16_8_;
          (pMVar28->u).mem.disp = out_op.u.mem.disp;
          pMVar28->data = out_op.data;
          *(undefined8 *)&pMVar28->field_0x8 = out_op._8_8_;
          (pMVar28->u).i = out_op.u.i;
          (pMVar28->u).str.s = out_op.u.str.s;
          insn[1].insn_link.next = (MIR_insn_t)in_op.u.i;
          *(char **)&insn[1].field_0x18 = in_op.u.str.s;
          insn[1].ops[0].data = (void *)in_op.u._16_8_;
          *(MIR_disp_t *)&insn[1].ops[0].field_0x8 = in_op.u.mem.disp;
          insn[1].data = in_op.data;
          insn[1].insn_link.prev = (MIR_insn_t)in_op._8_8_;
          insn[1].insn_link.next = (MIR_insn_t)in_op.u.i;
          *(char **)&insn[1].field_0x18 = in_op.u.str.s;
          MIR_output_insn(pMVar2,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
        }
        if ((((gen_ctx->optimize_level != 0) &&
             (puVar4 = (undefined8 *)insn->data, puVar4 != (undefined8 *)0x0)) &&
            (*(undefined8 **)(puVar4[6] + 0x50) == puVar4)) &&
           (*(undefined8 **)(puVar4[6] + 0x58) == puVar4)) {
          pMVar20 = MIR_new_insn_arr(gen_ctx->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          MIR_insert_insn_before
                    (gen_ctx->ctx,gen_ctx->curr_func_item,(MIR_insn_t_conflict)*puVar4,pMVar20);
          add_new_bb_insn(gen_ctx,pMVar20,(bb_t_conflict)puVar4[6],0);
        }
        gen_delete_insn(gen_ctx,insn);
        iVar31 = 1;
      }
      return iVar31;
    }
    pMVar32 = pMVar28 + sVar34;
    MVar14 = MIR_insn_op_mode(local_1c8,insn,sVar34,&out_p);
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      auVar1 = *(undefined1 (*) [32])pMVar32;
      pMVar23 = &out_op;
      if (out_p == 0) {
        pMVar23 = &in_op;
      }
      pMVar23->u = pMVar32->u;
      *(undefined1 (*) [32])pMVar23 = auVar1;
    }
    if (pMVar32->field_0x8 == '\v') {
      if ((iVar31 - 0xaaU < 0xfffffffd) || (*(byte *)&pMVar32->u - 0x11 < 0xfffffffb)) {
        MVar15 = *(MIR_reg_t *)((long)&pMVar32->u + 0x10);
        if (0x22 < MVar15 + 1) {
          MVar15 = change_reg(gen_ctx,&mem_op,MVar15,base_reg,MIR_OP_INT,insn,0);
          *(MIR_reg_t *)((long)&pMVar32->u + 0x10) = MVar15;
          if (MVar15 == 0xffffffff) {
            __assert_fail("op->u.var_mem.base != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1fcc,
                          "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                         );
          }
        }
        MVar15 = (pMVar32->u).mem.index;
        if (0x22 < MVar15 + 1) {
          MVar15 = change_reg(gen_ctx,&mem_op,MVar15,base_reg,MIR_OP_INT,insn,0);
          (pMVar32->u).mem.index = MVar15;
          if (MVar15 == 0xffffffff) {
            __assert_fail("op->u.var_mem.index != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1fd1,
                          "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                         );
          }
        }
      }
    }
    else if ((pMVar32->field_0x8 == '\x02') && (0x21 < (pMVar32->u).reg)) {
      if (MVar14 == MIR_OP_VAR) {
        if ((*(int *)&insn->field_0x18 != 0xb9) &&
           ((sVar34 != 1 || (3 < *(int *)&insn->field_0x18 - 0x1eU)))) {
          __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1fb5,
                        "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
          ;
        }
        MVar17 = MIR_reg_type(local_1c8,(pMVar32->u).reg - 0x21,(gen_ctx->curr_func_item->u).func);
        MVar14 = MIR_OP_FLOAT;
        if (MVar17 != MIR_T_F) {
          if (MVar17 == MIR_T_D) {
            MVar14 = MIR_OP_DOUBLE;
          }
          else {
            MVar14 = (uint)(MVar17 == MIR_T_LD) * 4 + MIR_OP_INT;
          }
        }
      }
      MVar15 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(ulong)(pMVar32->u).reg);
      if (((sVar34 == 0) && (*(int *)&insn->field_0x18 - 0x22U < 0xfffffffc)) && (0x21 < MVar15)) {
        local_1e8 = gen_ctx->ctx;
        MVar17 = MIR_reg_type(local_1e8,insn->ops[0].u.reg - 0x21,(gen_ctx->curr_func_item->u).func)
        ;
        MVar21 = target_get_stack_slot_offset(gen_ctx,MVar17,MVar15 - 0x22);
        insn = local_1d8;
        auVar1 = *(undefined1 (*) [32])local_1e0;
        MVar15 = local_1d8->ops[0].u.reg;
        aStack_1a8._16_8_ = SUB328((local_1e0->u).mem,0x10);
        aStack_1a8.mem.disp = (local_1e0->u).mem.disp;
        bi.bitmap = auVar1._0_8_;
        bi.nbit = auVar1._8_8_;
        aStack_1a8.i = auVar1._16_8_;
        aStack_1a8.str.s = auVar1._24_8_;
        _MIR_new_var_mem_op((MIR_op_t *)&nel,local_1e8,MVar17,MVar21,base_reg,0xffffffff,'\0');
        uVar30 = *(uint *)&insn->field_0x1c;
        uVar27 = 0;
        paVar26 = local_1d0;
        for (uVar25 = 0; (~((int)uVar30 >> 0x1f) & uVar30) != uVar25; uVar25 = uVar25 + 1) {
          if ((*(char *)((long)paVar26 + -8) == '\x02') && (paVar26->reg == MVar15)) {
            auVar10._4_4_ = nel._4_4_;
            auVar10._0_4_ = (uint)nel;
            auVar10._8_8_ = uStack_150;
            auVar10._16_8_ = aStack_148.i;
            auVar10._24_8_ = aStack_148.str.s;
            aVar11.str.s = aStack_148.str.s;
            aVar11.i = aStack_148.i;
            aVar11._16_8_ = aStack_148._16_8_;
            aVar11.mem.disp = aStack_148.mem.disp;
            *paVar26 = aVar11;
            *(undefined1 (*) [32])((long)paVar26 + -0x10) = auVar10;
            if (1 < (int)uVar27) {
              __assert_fail("n < 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1ef5,
                            "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                           );
            }
            lVar29 = (long)(int)uVar27;
            uVar27 = uVar27 + 1;
            (&early_clobbered_hard_reg2)[lVar29] = (MIR_reg_t)uVar25;
          }
          paVar26 = (anon_union_32_12_57d33f68_for_u *)((long)paVar26 + 0x30);
        }
        iVar16 = target_insn_ok_p(gen_ctx,insn);
        pMVar28 = local_1e0;
        if (iVar16 != 0) goto LAB_00144294;
        for (uVar25 = 0; (~((int)uVar27 >> 0x1f) & uVar27) != uVar25; uVar25 = uVar25 + 1) {
          MVar15 = (&early_clobbered_hard_reg2)[uVar25];
          auVar6._8_8_ = bi.nbit;
          auVar6._0_8_ = bi.bitmap;
          auVar6._16_8_ = aStack_1a8.i;
          auVar6._24_8_ = aStack_1a8.str.s;
          aVar7._16_8_ = aStack_1a8._16_8_;
          aVar7._0_8_ = SUB168(auVar1._16_16_,0);
          aVar7._8_8_ = (char *)SUB168(auVar1._16_16_,8);
          aVar7.mem.disp = aStack_1a8.mem.disp;
          local_1e0[(int)MVar15].u = aVar7;
          *(undefined1 (*) [32])(local_1e0 + (int)MVar15) = auVar6;
        }
      }
      MVar15 = change_reg(gen_ctx,&mem_op,(pMVar32->u).reg,base_reg,MVar14,insn,out_p);
      if (MVar15 == 0xffffffff) {
        auVar8._4_4_ = mem_op.data._4_4_;
        auVar8._0_4_ = (uint)mem_op.data;
        auVar8._8_8_ = mem_op._8_8_;
        auVar8._16_8_ = mem_op.u.i;
        auVar8._24_8_ = mem_op.u.str.s;
        aVar9.str.s = mem_op.u.str.s;
        aVar9.i = mem_op.u.i;
        aVar9._16_8_ = mem_op.u._16_8_;
        aVar9.mem.disp = mem_op.u.mem.disp;
        pMVar32->u = aVar9;
        *(undefined1 (*) [32])pMVar32 = auVar8;
      }
      else {
        (pMVar32->u).reg = MVar15;
      }
    }
LAB_00144294:
    sVar34 = sVar34 + 1;
  } while( true );
}

Assistant:

static int rewrite_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, MIR_reg_t base_reg,
                         struct rewrite_data *data) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  size_t nops, i;
  MIR_op_t *op, mem_op;
#if !MIR_NO_GEN_DEBUG
  MIR_op_t in_op = MIR_new_int_op (ctx, 0),
           out_op = MIR_new_int_op (ctx, 0); /* To remove unitilized warning */
#endif
  MIR_op_mode_t data_mode;
  MIR_reg_t hard_reg, reg;
  int out_p, call_p, addr_reload_p, rld_in_num;
  int out_mem_op_num, in_mem_op_num, other_mem_op_num;
  nops = MIR_insn_nops (ctx, insn);
  out_mem_op_num = in_mem_op_num = -1;
  rld_in_num = 0;
  /* Update live info, save/restore regs living across calls, and check do we need addr reload:
   */
  for (int niter = 0; niter <= 1; niter++) {
    for (i = 0; i < nops; i++) {
      op = &insn->ops[i];
      data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (niter == 0 && (!out_p || op->mode == MIR_OP_VAR_MEM)) continue;
      if (niter == 1 && (out_p && op->mode != MIR_OP_VAR_MEM)) continue;
      switch (op->mode) {
      case MIR_OP_VAR:
        if (op->u.var <= MAX_HARD_REG) {
          bitmap_set_bit_p (func_used_hard_regs, op->u.var);
          if (data != NULL) update_live (op->u.var, out_p, data->live);
        } else {
          if (!out_p && VARR_GET (MIR_reg_t, reg_renumber, op->u.var) > MAX_HARD_REG
              && mode2type (data_mode) == MIR_T_I64)
            rld_in_num++;
          if (data != NULL) {
            update_live (op->u.var, out_p, data->live);
            if (bitmap_clear_bit_p (data->regs_to_save, op->u.var)) /* put (slot<-hr) after insn */
              spill_restore_reg (gen_ctx, op->u.var, base_reg, insn, TRUE, FALSE);
          }
        }
        break;
      case MIR_OP_VAR_MEM:
        if (op->u.var_mem.base <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.base);
        if (op->u.var_mem.index <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.index);
        if (op->u.var_mem.base != MIR_NON_VAR && op->u.var_mem.index != MIR_NON_VAR
            && op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.index > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.base) > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.index) > MAX_HARD_REG) {
          other_mem_op_num = -1;
          if (out_p) {
            gen_assert (out_mem_op_num < 0);
            out_mem_op_num = (int) i;
            if (in_mem_op_num >= 0) other_mem_op_num = in_mem_op_num;
          } else {
            gen_assert (in_mem_op_num < 0);
            in_mem_op_num = (int) i;
            if (out_mem_op_num >= 0) other_mem_op_num = out_mem_op_num;
          }
          if (other_mem_op_num < 0
              || op->u.var_mem.base != insn->ops[other_mem_op_num].u.var_mem.base
              || op->u.var_mem.index != insn->ops[other_mem_op_num].u.var_mem.index)
            rld_in_num += 2;
        }
        if (data != NULL) {
          if (op->u.var_mem.base != MIR_NON_VAR) {
            update_live (op->u.var_mem.base, FALSE, data->live);
            if (op->u.var_mem.base > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.base)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.base, base_reg, insn, TRUE, FALSE);
            }
          }
          if (op->u.var_mem.index != MIR_NON_VAR) {
            update_live (op->u.var_mem.index, FALSE, data->live);
            if (op->u.var_mem.index > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.index)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.index, base_reg, insn, TRUE, FALSE);
            }
          }
        }
        break;
      default: /* do nothing */ break;
      }
    }
    if (data != NULL && niter == 0) { /* right after processing outputs */
      MIR_reg_t early_clobbered_hard_reg1, early_clobbered_hard_reg2;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg1, TRUE, data->live);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg2, TRUE, data->live);
      if (MIR_call_code_p (insn->code)) {
        size_t nel;
        bb_insn_t bb_insn = insn->data;
        bitmap_iterator_t bi;
        FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
          update_live ((MIR_reg_t) nel, TRUE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
          update_live ((MIR_reg_t) nel, FALSE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, data->live, nel) {
          if (nel <= MAX_HARD_REG) continue;
          reg = (MIR_reg_t) nel;
          if (bitmap_bit_p (data->bb->spill_gen, reg)) continue; /* will be spilled in split */
          MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
          if (loc > MAX_HARD_REG) continue;
          type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
          int nregs = target_locs_num (loc, type);
          if (hreg_in_bitmap_p (loc, type, nregs, call_used_hard_regs[MIR_T_UNDEF])
              && bitmap_set_bit_p (data->regs_to_save, reg)) /* put (hr<-slot) after call */
            spill_restore_reg (gen_ctx, reg, base_reg, insn, TRUE, TRUE);
        }
      }
    }
  }
  addr_reload_p = rld_in_num > 2;
  out_reloads_num = in_reloads_num = 0;
  if (addr_reload_p) { /* not enough 2 temp int hard regs: address reload: */
    reload_addr (gen_ctx, insn, in_mem_op_num, out_mem_op_num, base_reg);
    get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64,
                     FALSE); /* reserve the 1st int temp hard reg */
  }
  if (MIR_addr_code_p (insn->code)) transform_addr (gen_ctx, insn, base_reg);
  call_p = MIR_call_code_p (insn->code);
  for (i = 0; i < nops; i++) {
    op = &insn->ops[i];
    data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
    DEBUG (2, {
      if (out_p)
        out_op = *op; /* we don't care about multiple call outputs here */
      else
        in_op = *op;
    });
    switch (op->mode) {
    case MIR_OP_VAR:
      if (op->u.var <= MAX_HARD_REG) break;
      if (data_mode == MIR_OP_VAR) {
        gen_assert (insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1));
        type = MIR_reg_type (ctx, op->u.var - MAX_HARD_REG, curr_func_item->u.func);
        data_mode = type == MIR_T_F    ? MIR_OP_FLOAT
                    : type == MIR_T_D  ? MIR_OP_DOUBLE
                    : type == MIR_T_LD ? MIR_OP_LDOUBLE
                                       : MIR_OP_INT;
      }
      MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, op->u.var);
      if (!MIR_addr_code_p (insn->code) && i == 0 && loc > MAX_HARD_REG
          && try_spilled_reg_mem (gen_ctx, insn, (int) i, loc, base_reg))
        break;
      hard_reg = change_reg (gen_ctx, &mem_op, op->u.var, base_reg, data_mode, insn, out_p);
      if (hard_reg == MIR_NON_VAR) { /* we don't use hard regs for this type reg (e.g. ldouble) */
        *op = mem_op;
      } else {
        op->u.var = hard_reg;
      }
      break;
    case MIR_OP_VAR_MEM:
      if (call_p && MIR_blk_type_p (op->u.var_mem.type)) break;
      if (op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.base != MIR_NON_VAR) {
        op->u.var_mem.base
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.base, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.base != MIR_NON_VAR); /* we can always use GP regs */
      }
      if (op->u.var_mem.index > MAX_HARD_REG && op->u.var_mem.index != MIR_NON_VAR) {
        op->u.var_mem.index
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.index, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.index != MIR_NON_VAR); /* we can always use GP regs */
      }
      break;
    default: /* do nothing */ break;
    }
  }
  if (move_code_p (insn->code)) {
    if (MIR_op_eq_p (ctx, insn->ops[0], insn->ops[1])) {
      DEBUG (2, {
        fprintf (debug_file, "Deleting noop move ");
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
        fprintf (debug_file, " which was ");
        insn->ops[0] = out_op;
        insn->ops[1] = in_op;
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
      });
      bb_insn_t bb_insn;
      if (optimize_level > 0 && (bb_insn = insn->data) != NULL
          && DLIST_HEAD (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn
          && DLIST_TAIL (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn) { /* avoid empty bb */
        MIR_insn_t nop = MIR_new_insn_arr (gen_ctx->ctx, MIR_USE, 0, NULL);
        MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, bb_insn->insn, nop);
        add_new_bb_insn (gen_ctx, nop, bb_insn->bb, FALSE);
      }
      gen_delete_insn (gen_ctx, insn);
      return 1;
    }
  }
  return 0;
}